

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void __thiscall Json::OurReader::OurReader(OurReader *this,OurFeatures *features)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  std::stack<Json::Value*,std::deque<Json::Value*,std::allocator<Json::Value*>>>::
  stack<std::deque<Json::Value*,std::allocator<Json::Value*>>,void>(&this->nodes_);
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::
  _Deque_base(&(this->errors_).
               super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
             );
  (this->document_)._M_dataplus._M_p = (pointer)&(this->document_).field_2;
  (this->document_)._M_string_length = 0;
  (this->document_).field_2._M_local_buf[0] = '\0';
  this->begin_ = (Location)0x0;
  this->end_ = (Location)0x0;
  this->current_ = (Location)0x0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  (this->commentsBefore_)._M_dataplus._M_p = (pointer)&(this->commentsBefore_).field_2;
  (this->commentsBefore_)._M_string_length = 0;
  (this->commentsBefore_).field_2._M_local_buf[0] = '\0';
  bVar1 = features->strictRoot_;
  bVar2 = features->allowDroppedNullPlaceholders_;
  bVar3 = features->allowNumericKeys_;
  bVar4 = features->allowSingleQuotes_;
  bVar5 = features->failIfExtra_;
  bVar6 = features->rejectDupKeys_;
  bVar7 = features->allowSpecialFloats_;
  (this->features_).allowComments_ = features->allowComments_;
  (this->features_).strictRoot_ = bVar1;
  (this->features_).allowDroppedNullPlaceholders_ = bVar2;
  (this->features_).allowNumericKeys_ = bVar3;
  (this->features_).allowSingleQuotes_ = bVar4;
  (this->features_).failIfExtra_ = bVar5;
  (this->features_).rejectDupKeys_ = bVar6;
  (this->features_).allowSpecialFloats_ = bVar7;
  (this->features_).stackLimit_ = features->stackLimit_;
  this->collectComments_ = false;
  return;
}

Assistant:

OurReader::OurReader(OurFeatures const& features)
    : errors_(), document_(), begin_(), end_(), current_(), lastValueEnd_(),
      lastValue_(), commentsBefore_(),
      features_(features), collectComments_() {
}